

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O1

void interpolative_internal::decode_interpolative
               (bit_stream *is,uint32_t *out_buf,size_t n,size_t low,size_t high)

{
  long lVar1;
  size_t high_00;
  uint64_t uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  while( true ) {
    if (n == 0) {
      return;
    }
    uVar4 = n + 1 >> 1;
    lVar1 = (uVar4 - 1) + low;
    lVar7 = lVar1 + (n - uVar4);
    lVar3 = high - lVar7;
    uVar8 = lVar3 + 1;
    uVar6 = 0x40 - LZCOUNT(high - lVar7);
    if (lVar3 == 0) {
      uVar6 = 0;
    }
    uVar5 = 1;
    lVar7 = 1L << (uVar6 & 0x3f);
    if (lVar3 != 0) {
      uVar9 = lVar7 - uVar8;
      uVar2 = bit_stream::get_int(is,uVar6 - 1);
      uVar5 = uVar2 + 1;
      if (uVar9 < uVar5) {
        uVar2 = bit_stream::get_int(is,1);
        uVar5 = ~uVar9 + uVar5 * 2 + uVar2;
      }
    }
    uVar5 = (uVar8 * 2 - lVar7 >> 1) + uVar5;
    if (uVar5 <= uVar8) {
      uVar8 = 0;
    }
    lVar7 = uVar5 - uVar8;
    high_00 = lVar1 + -2 + lVar7;
    out_buf[uVar4 - 1] = (uint32_t)high_00;
    if (uVar4 - 1 != 0) {
      decode_interpolative(is,out_buf,uVar4 - 1,low,high_00);
    }
    if (n == uVar4) break;
    out_buf = out_buf + uVar4;
    low = lVar7 + lVar1;
    n = n - uVar4;
  }
  return;
}

Assistant:

static inline void decode_interpolative(
        bit_stream& is, uint32_t* out_buf, size_t n, size_t low, size_t high)
    {
        if (n == 0ULL)
            return;
        uint64_t h = (n + 1ULL) >> 1ULL;
        uint64_t n1 = h - 1ULL;
        uint64_t n2 = n - h;
        uint64_t v = low + n1 - 1ULL
            + read_center_mid(is, high - n2 - low - n1 + 1ULL);

        out_buf[h - 1] = v - 1; // we don't encode 0
        if (n1)
            decode_interpolative(is, out_buf, n1, low, v - 1ULL);
        if (n2)
            decode_interpolative(is, out_buf + h, n2, v + 1ULL, high);
    }